

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsuite.c
# Opt level: O2

xmlParserErrors
testResourceLoader(void *vctxt,char *URL,char *ID,xmlResourceType type,xmlParserInputFlags flags,
                  xmlParserInputPtr *out)

{
  char *__s1;
  ulong uVar1;
  int iVar2;
  xmlParserErrors xVar3;
  xmlParserInputPtr pxVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar6 = (ulong)(uint)nb_entities;
  if (nb_entities < 1) {
    uVar6 = 0;
  }
  uVar1 = 0;
  do {
    uVar5 = uVar1;
    if (uVar6 * 8 == uVar5) {
      xVar3 = xmlNewInputFromUrl(URL,0,out);
      return xVar3;
    }
    __s1 = *(char **)((long)testEntitiesName + uVar5);
    iVar2 = strcmp(__s1,URL);
    uVar1 = uVar5 + 8;
  } while (iVar2 != 0);
  pxVar4 = (xmlParserInputPtr)
           xmlNewInputFromString(__s1,*(undefined8 *)((long)testEntitiesValue + uVar5),2);
  *out = pxVar4;
  return XML_ERR_OK;
}

Assistant:

static xmlParserErrors
testResourceLoader(void *vctxt ATTRIBUTE_UNUSED, const char *URL,
                   const char *ID ATTRIBUTE_UNUSED,
                   xmlResourceType type ATTRIBUTE_UNUSED,
                   xmlParserInputFlags flags ATTRIBUTE_UNUSED,
                   xmlParserInputPtr *out) {
    int i;

    for (i = 0; i < nb_entities; i++) {
        if (!strcmp(testEntitiesName[i], URL)) {
	    *out = xmlNewInputFromString(testEntitiesName[i],
                                        testEntitiesValue[i],
                                        XML_INPUT_BUF_STATIC);
	    return(XML_ERR_OK);
	}
    }

    return(xmlNewInputFromUrl(URL, 0, out));
}